

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# material.h
# Opt level: O2

bool __thiscall
isotropic::scatter(isotropic *this,ray *r_in,hit_record *rec,color *attenuation,ray *scattered)

{
  double dVar1;
  element_type *peVar2;
  double local_68;
  double dStack_60;
  double local_58;
  double local_50;
  double local_48;
  double dStack_40;
  
  random_unit_vector();
  dVar1 = r_in->tm;
  local_58 = (rec->p).e[2];
  local_68 = (rec->p).e[0];
  dStack_60 = (rec->p).e[1];
  (scattered->dir).e[1] = local_48;
  (scattered->dir).e[2] = dStack_40;
  (scattered->orig).e[2] = local_58;
  (scattered->dir).e[0] = local_50;
  (scattered->orig).e[0] = local_68;
  (scattered->orig).e[1] = dStack_60;
  scattered->tm = dVar1;
  peVar2 = (this->tex).super___shared_ptr<texture,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  (*peVar2->_vptr_texture[2])(SUB84(rec->u,0),SUB84(rec->v,0),&local_68,peVar2,rec);
  attenuation->e[2] = local_58;
  attenuation->e[0] = local_68;
  attenuation->e[1] = dStack_60;
  return true;
}

Assistant:

bool scatter(const ray& r_in, const hit_record& rec, color& attenuation, ray& scattered)
    const override {
        scattered = ray(rec.p, random_unit_vector(), r_in.time());
        attenuation = tex->value(rec.u, rec.v, rec.p);
        return true;
    }